

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenRefFuncSetFunc(BinaryenExpressionRef expr,char *funcName)

{
  IString *this;
  undefined1 in_CL;
  string_view sVar1;
  
  if (expr->_id == RefFuncId) {
    this = (IString *)strlen(funcName);
    sVar1._M_str = (char *)0x0;
    sVar1._M_len = (size_t)funcName;
    sVar1 = wasm::IString::interned(this,sVar1,(bool)in_CL);
    *(string_view *)(expr + 1) = sVar1;
    return;
  }
  __assert_fail("expression->is<RefFunc>()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xe38,"void BinaryenRefFuncSetFunc(BinaryenExpressionRef, const char *)");
}

Assistant:

void BinaryenRefFuncSetFunc(BinaryenExpressionRef expr, const char* funcName) {
  auto* expression = (Expression*)expr;
  assert(expression->is<RefFunc>());
  static_cast<RefFunc*>(expression)->func = funcName;
}